

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

ompt_set_result_t ompt_set_callback(ompt_callbacks_t which,ompt_callback_t callback)

{
  ompt_callback_t callback_local;
  ompt_callbacks_t which_local;
  ompt_set_result_t local_4;
  
  switch(which) {
  case ompt_callback_thread_begin:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffffd |
                   (ulong)(callback != (ompt_callback_t)0x0) << 1);
    ompt_callbacks.ompt_callback_thread_begin_callback = (ompt_callback_thread_begin_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_thread_end:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffffb |
                   (ulong)(callback != (ompt_callback_t)0x0) << 2);
    ompt_callbacks.ompt_callback_thread_end_callback = (ompt_callback_thread_end_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_parallel_begin:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffff7 |
                   (ulong)(callback != (ompt_callback_t)0x0) << 3);
    ompt_callbacks.ompt_callback_parallel_begin_callback = (ompt_callback_parallel_begin_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_parallel_end:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffffffef |
                   (ulong)(callback != (ompt_callback_t)0x0) << 4);
    ompt_callbacks.ompt_callback_parallel_end_callback = (ompt_callback_parallel_end_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_task_create:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffffffdf |
                   (ulong)(callback != (ompt_callback_t)0x0) << 5);
    ompt_callbacks.ompt_callback_task_create_callback = (ompt_callback_task_create_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_task_schedule:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffffffbf |
                   (ulong)(callback != (ompt_callback_t)0x0) << 6);
    ompt_callbacks.ompt_callback_task_schedule_callback = (ompt_callback_task_schedule_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_implicit_task:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffffff7f |
                   (ulong)(callback != (ompt_callback_t)0x0) << 7);
    ompt_callbacks.ompt_callback_implicit_task_callback = (ompt_callback_implicit_task_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_target:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffeff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 8);
    ompt_callbacks.ompt_callback_target_callback = (ompt_callback_target_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_target_data_op:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffdff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 9);
    ompt_callbacks.ompt_callback_target_data_op_callback = (ompt_callback_target_data_op_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_target_submit:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffbff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 10);
    ompt_callbacks.ompt_callback_target_submit_callback = (ompt_callback_target_submit_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_control_tool:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffff7ff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0xb);
    ompt_callbacks.ompt_callback_control_tool_callback = (ompt_callback_control_tool_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_device_initialize:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffffefff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0xc);
    ompt_callbacks.ompt_callback_device_initialize_callback =
         (ompt_callback_device_initialize_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_device_finalize:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffffdfff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0xd);
    ompt_callbacks.ompt_callback_device_finalize_callback =
         (ompt_callback_device_finalize_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_device_load:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffffbfff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0xe);
    ompt_callbacks.ompt_callback_device_load_callback = (ompt_callback_device_load_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_device_unload:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffff7fff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0xf);
    ompt_callbacks.ompt_callback_device_unload_callback = (ompt_callback_device_unload_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_sync_region_wait:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffeffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x10);
    ompt_callbacks.ompt_callback_sync_region_wait_callback = (ompt_callback_sync_region_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_mutex_released:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffdffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x11);
    ompt_callbacks.ompt_callback_mutex_released_callback = (ompt_callback_mutex_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_dependences:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffbffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x12);
    ompt_callbacks.ompt_callback_dependences_callback = (ompt_callback_dependences_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_task_dependence:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffff7ffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x13);
    ompt_callbacks.ompt_callback_task_dependence_callback =
         (ompt_callback_task_dependence_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_work:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffefffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x14);
    ompt_callbacks.ompt_callback_work_callback = (ompt_callback_work_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_master:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffdfffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x15);
    ompt_callbacks.ompt_callback_master_callback = (ompt_callback_master_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_target_map:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffffbfffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x16);
    ompt_callbacks.ompt_callback_target_map_callback = (ompt_callback_target_map_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_sync_region:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffff7fffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x17);
    ompt_callbacks.ompt_callback_sync_region_callback = (ompt_callback_sync_region_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_lock_init:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffeffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x18);
    ompt_callbacks.ompt_callback_lock_init_callback = (ompt_callback_mutex_acquire_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_lock_destroy:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffdffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x19);
    ompt_callbacks.ompt_callback_lock_destroy_callback = (ompt_callback_mutex_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_mutex_acquire:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffbffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x1a);
    ompt_callbacks.ompt_callback_mutex_acquire_callback = (ompt_callback_mutex_acquire_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_mutex_acquired:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffff7ffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x1b);
    ompt_callbacks.ompt_callback_mutex_acquired_callback = (ompt_callback_mutex_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_nest_lock:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffefffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x1c);
    ompt_callbacks.ompt_callback_nest_lock_callback = (ompt_callback_nest_lock_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_flush:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffdfffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x1d);
    ompt_callbacks.ompt_callback_flush_callback = (ompt_callback_flush_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_cancel:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffffbfffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x1e);
    ompt_callbacks.ompt_callback_cancel_callback = (ompt_callback_cancel_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_always;
    }
    break;
  case ompt_callback_reduction:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xffffffff7fffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x1f);
    ompt_callbacks.ompt_callback_reduction_callback = (ompt_callback_sync_region_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_never;
    }
    break;
  case ompt_callback_dispatch:
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffeffffffff |
                   (ulong)(callback != (ompt_callback_t)0x0) << 0x20);
    ompt_callbacks.ompt_callback_dispatch_callback = (ompt_callback_dispatch_t)callback;
    if (callback == (ompt_callback_t)0x0) {
      local_4 = ompt_set_always;
    }
    else {
      local_4 = ompt_set_never;
    }
    break;
  default:
    local_4 = ompt_set_error;
  }
  return local_4;
}

Assistant:

OMPT_API_ROUTINE ompt_set_result_t ompt_set_callback(ompt_callbacks_t which,
                                       ompt_callback_t callback) {
  switch (which) {

#define ompt_event_macro(event_name, callback_type, event_id)                  \
  case event_name:                                                             \
    if (ompt_event_implementation_status(event_name)) {                        \
      ompt_callbacks.ompt_callback(event_name) = (callback_type)callback;      \
      ompt_enabled.event_name = (callback != 0);                               \
    }                                                                          \
    if (callback)                                                              \
      return ompt_event_implementation_status(event_name);                     \
    else                                                                       \
      return ompt_set_always;

    FOREACH_OMPT_EVENT(ompt_event_macro)

#undef ompt_event_macro

  default:
    return ompt_set_error;
  }
}